

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  byte bVar17;
  uint uVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  Scene *pSVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  float fVar77;
  float fVar78;
  undefined1 auVar76 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2655;
  uint local_2654;
  ulong local_2650;
  Scene *local_2648;
  ulong local_2640;
  int local_2634;
  RayHit *local_2630;
  RayQueryContext *local_2628;
  RTCIntersectArguments *local_2620;
  Geometry *local_2618;
  ulong *local_2610;
  long local_2608;
  long local_2600;
  RTCFilterFunctionNArguments local_25f8;
  float local_25c8;
  undefined4 local_25c4;
  undefined4 local_25c0;
  undefined4 local_25bc;
  undefined4 local_25b8;
  undefined4 local_25b4;
  uint local_25b0;
  uint local_25ac;
  uint local_25a8;
  undefined1 local_2598 [16];
  undefined1 local_2588 [16];
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined1 local_2568 [32];
  undefined1 local_2548 [32];
  undefined1 local_2528 [32];
  undefined1 local_2508 [32];
  undefined1 local_24e8 [32];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 *local_2498;
  byte local_2490;
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  float local_2438 [4];
  undefined8 local_2428;
  undefined8 uStack_2420;
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    local_2610 = local_2368;
    auVar50 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar51 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    auVar30 = vandps_avx512vl((undefined1  [16])aVar2,auVar30);
    auVar31._8_4_ = 0x219392ef;
    auVar31._0_8_ = 0x219392ef219392ef;
    auVar31._12_4_ = 0x219392ef;
    uVar26 = vcmpps_avx512vl(auVar30,auVar31,1);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar88 = ZEXT1664(auVar30);
    auVar30 = vdivps_avx512vl(auVar30,(undefined1  [16])aVar2);
    auVar31 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar9 = (bool)((byte)uVar26 & 1);
    auVar34._0_4_ = (uint)bVar9 * auVar31._0_4_ | (uint)!bVar9 * auVar30._0_4_;
    bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar34._4_4_ = (uint)bVar9 * auVar31._4_4_ | (uint)!bVar9 * auVar30._4_4_;
    bVar9 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar34._8_4_ = (uint)bVar9 * auVar31._8_4_ | (uint)!bVar9 * auVar30._8_4_;
    bVar9 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar34._12_4_ = (uint)bVar9 * auVar31._12_4_ | (uint)!bVar9 * auVar30._12_4_;
    auVar32._8_4_ = 0x3f7ffffa;
    auVar32._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar32._12_4_ = 0x3f7ffffa;
    auVar32 = vmulps_avx512vl(auVar34,auVar32);
    auVar33._8_4_ = 0x3f800003;
    auVar33._0_8_ = 0x3f8000033f800003;
    auVar33._12_4_ = 0x3f800003;
    auVar33 = vmulps_avx512vl(auVar34,auVar33);
    local_24e8 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar89 = ZEXT3264(local_24e8);
    local_2508 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar90 = ZEXT3264(local_2508);
    local_2370[0] = 0;
    local_2528 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar91 = ZEXT3264(local_2528);
    local_2548 = vbroadcastss_avx512vl(auVar32);
    auVar92 = ZEXT3264(local_2548);
    auVar30 = vmovshdup_avx(auVar32);
    local_2568 = vbroadcastsd_avx512vl(auVar30);
    auVar93 = ZEXT3264(local_2568);
    auVar31 = vshufpd_avx(auVar32,auVar32,1);
    auVar54._8_4_ = 2;
    auVar54._0_8_ = 0x200000002;
    auVar54._12_4_ = 2;
    auVar54._16_4_ = 2;
    auVar54._20_4_ = 2;
    auVar54._24_4_ = 2;
    auVar54._28_4_ = 2;
    local_2398 = vpermps_avx2(auVar54,ZEXT1632(auVar32));
    auVar75 = ZEXT3264(local_2398);
    fVar62 = auVar33._0_4_;
    auVar53._8_4_ = 1;
    auVar53._0_8_ = 0x100000001;
    auVar53._12_4_ = 1;
    auVar53._16_4_ = 1;
    auVar53._20_4_ = 1;
    auVar53._24_4_ = 1;
    auVar53._28_4_ = 1;
    local_23d8 = vpermps_avx2(auVar53,ZEXT1632(auVar33));
    auVar83 = ZEXT3264(local_23d8);
    local_23f8 = vpermps_avx2(auVar54,ZEXT1632(auVar33));
    auVar84 = ZEXT3264(local_23f8);
    uVar26 = (ulong)(auVar32._0_4_ < 0.0) << 5;
    uVar24 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x40;
    uVar29 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x80;
    uVar28 = uVar26 ^ 0x20;
    uVar68 = auVar50._0_4_;
    local_2418._4_4_ = uVar68;
    local_2418._0_4_ = uVar68;
    local_2418._8_4_ = uVar68;
    local_2418._12_4_ = uVar68;
    local_2418._16_4_ = uVar68;
    local_2418._20_4_ = uVar68;
    local_2418._24_4_ = uVar68;
    local_2418._28_4_ = uVar68;
    auVar85 = ZEXT3264(local_2418);
    uVar68 = auVar51._0_4_;
    auVar67 = ZEXT3264(CONCAT428(uVar68,CONCAT424(uVar68,CONCAT420(uVar68,CONCAT416(uVar68,CONCAT412
                                                  (uVar68,CONCAT48(uVar68,CONCAT44(uVar68,uVar68))))
                                                  ))));
    auVar86 = ZEXT3264(_DAT_01fe9900);
    auVar87 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_2628 = context;
    local_2630 = ray;
    local_23b8 = fVar62;
    fStack_23b4 = fVar62;
    fStack_23b0 = fVar62;
    fStack_23ac = fVar62;
    fStack_23a8 = fVar62;
    fStack_23a4 = fVar62;
    fStack_23a0 = fVar62;
    fStack_239c = fVar62;
    fVar77 = fVar62;
    fVar78 = fVar62;
    fVar79 = fVar62;
    fVar80 = fVar62;
    fVar81 = fVar62;
    fVar82 = fVar62;
    local_2650 = uVar26;
    do {
      pfVar5 = (float *)(local_2610 + -1);
      local_2610 = local_2610 + -2;
      if (*pfVar5 <= (ray->super_RayK<1>).tfar) {
        uVar27 = *local_2610;
        while ((uVar27 & 8) == 0) {
          auVar53 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar26),auVar89._0_32_);
          auVar53 = vmulps_avx512vl(auVar92._0_32_,auVar53);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar24),auVar90._0_32_);
          auVar54 = vmulps_avx512vl(auVar93._0_32_,auVar54);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar29),auVar91._0_32_);
          auVar55._4_4_ = auVar75._4_4_ * auVar54._4_4_;
          auVar55._0_4_ = auVar75._0_4_ * auVar54._0_4_;
          auVar55._8_4_ = auVar75._8_4_ * auVar54._8_4_;
          auVar55._12_4_ = auVar75._12_4_ * auVar54._12_4_;
          auVar55._16_4_ = auVar75._16_4_ * auVar54._16_4_;
          auVar55._20_4_ = auVar75._20_4_ * auVar54._20_4_;
          auVar55._24_4_ = auVar75._24_4_ * auVar54._24_4_;
          auVar55._28_4_ = auVar54._28_4_;
          auVar54 = vmaxps_avx(auVar55,auVar85._0_32_);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + uVar28),auVar89._0_32_);
          auVar56._4_4_ = fVar77 * auVar54._4_4_;
          auVar56._0_4_ = fVar62 * auVar54._0_4_;
          auVar56._8_4_ = fVar78 * auVar54._8_4_;
          auVar56._12_4_ = fVar79 * auVar54._12_4_;
          auVar56._16_4_ = fVar80 * auVar54._16_4_;
          auVar56._20_4_ = fVar81 * auVar54._20_4_;
          auVar56._24_4_ = fVar82 * auVar54._24_4_;
          auVar56._28_4_ = auVar54._28_4_;
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar24 ^ 0x20)),
                                    auVar90._0_32_);
          auVar57._4_4_ = auVar83._4_4_ * auVar54._4_4_;
          auVar57._0_4_ = auVar83._0_4_ * auVar54._0_4_;
          auVar57._8_4_ = auVar83._8_4_ * auVar54._8_4_;
          auVar57._12_4_ = auVar83._12_4_ * auVar54._12_4_;
          auVar57._16_4_ = auVar83._16_4_ * auVar54._16_4_;
          auVar57._20_4_ = auVar83._20_4_ * auVar54._20_4_;
          auVar57._24_4_ = auVar83._24_4_ * auVar54._24_4_;
          auVar57._28_4_ = auVar54._28_4_;
          auVar54 = vminps_avx(auVar56,auVar57);
          auVar55 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar29 ^ 0x20)),
                                    auVar91._0_32_);
          auVar60._4_4_ = auVar84._4_4_ * auVar55._4_4_;
          auVar60._0_4_ = auVar84._0_4_ * auVar55._0_4_;
          auVar60._8_4_ = auVar84._8_4_ * auVar55._8_4_;
          auVar60._12_4_ = auVar84._12_4_ * auVar55._12_4_;
          auVar60._16_4_ = auVar84._16_4_ * auVar55._16_4_;
          auVar60._20_4_ = auVar84._20_4_ * auVar55._20_4_;
          auVar60._24_4_ = auVar84._24_4_ * auVar55._24_4_;
          auVar60._28_4_ = auVar55._28_4_;
          auVar55 = vminps_avx(auVar60,auVar67._0_32_);
          auVar54 = vminps_avx(auVar54,auVar55);
          uVar23 = vcmpps_avx512vl(auVar53,auVar54,2);
          bVar17 = (byte)uVar23;
          if (bVar17 == 0) goto LAB_01f1b81b;
          auVar54 = *(undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0);
          auVar55 = ((undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0))[1];
          auVar56 = vpternlogd_avx512vl(auVar86._0_32_,auVar53,auVar87._0_32_,0xf8);
          auVar57 = vpcompressd_avx512vl(auVar56);
          auVar59._0_4_ =
               (uint)(bVar17 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar17 & 1) * auVar56._0_4_;
          bVar9 = (bool)((byte)(uVar23 >> 1) & 1);
          auVar59._4_4_ = (uint)bVar9 * auVar57._4_4_ | (uint)!bVar9 * auVar56._4_4_;
          bVar9 = (bool)((byte)(uVar23 >> 2) & 1);
          auVar59._8_4_ = (uint)bVar9 * auVar57._8_4_ | (uint)!bVar9 * auVar56._8_4_;
          bVar9 = (bool)((byte)(uVar23 >> 3) & 1);
          auVar59._12_4_ = (uint)bVar9 * auVar57._12_4_ | (uint)!bVar9 * auVar56._12_4_;
          bVar9 = (bool)((byte)(uVar23 >> 4) & 1);
          auVar59._16_4_ = (uint)bVar9 * auVar57._16_4_ | (uint)!bVar9 * auVar56._16_4_;
          bVar9 = (bool)((byte)(uVar23 >> 5) & 1);
          auVar59._20_4_ = (uint)bVar9 * auVar57._20_4_ | (uint)!bVar9 * auVar56._20_4_;
          bVar9 = (bool)((byte)(uVar23 >> 6) & 1);
          auVar59._24_4_ = (uint)bVar9 * auVar57._24_4_ | (uint)!bVar9 * auVar56._24_4_;
          bVar9 = SUB81(uVar23 >> 7,0);
          auVar59._28_4_ = (uint)bVar9 * auVar57._28_4_ | (uint)!bVar9 * auVar56._28_4_;
          auVar56 = vpermt2q_avx512vl(auVar54,auVar59,auVar55);
          uVar27 = auVar56._0_8_;
          bVar17 = bVar17 - 1 & bVar17;
          if (bVar17 != 0) {
            auVar56 = vpshufd_avx2(auVar59,0x55);
            vpermt2q_avx512vl(auVar54,auVar56,auVar55);
            auVar57 = vpminsd_avx2(auVar59,auVar56);
            auVar56 = vpmaxsd_avx2(auVar59,auVar56);
            bVar17 = bVar17 - 1 & bVar17;
            if (bVar17 == 0) {
              auVar57 = vpermi2q_avx512vl(auVar57,auVar54,auVar55);
              uVar27 = auVar57._0_8_;
              auVar54 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
              *local_2610 = auVar54._0_8_;
              auVar53 = vpermd_avx2(auVar56,auVar53);
              *(int *)(local_2610 + 1) = auVar53._0_4_;
              local_2610 = local_2610 + 2;
            }
            else {
              auVar61 = vpshufd_avx2(auVar59,0xaa);
              vpermt2q_avx512vl(auVar54,auVar61,auVar55);
              auVar60 = vpminsd_avx2(auVar57,auVar61);
              auVar57 = vpmaxsd_avx2(auVar57,auVar61);
              auVar61 = vpminsd_avx2(auVar56,auVar57);
              auVar56 = vpmaxsd_avx2(auVar56,auVar57);
              bVar17 = bVar17 - 1 & bVar17;
              if (bVar17 == 0) {
                auVar57 = vpermi2q_avx512vl(auVar60,auVar54,auVar55);
                uVar27 = auVar57._0_8_;
                auVar57 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                *local_2610 = auVar57._0_8_;
                auVar56 = vpermd_avx2(auVar56,auVar53);
                *(int *)(local_2610 + 1) = auVar56._0_4_;
                auVar54 = vpermt2q_avx512vl(auVar54,auVar61,auVar55);
                local_2610[2] = auVar54._0_8_;
                auVar53 = vpermd_avx2(auVar61,auVar53);
                *(int *)(local_2610 + 3) = auVar53._0_4_;
                local_2610 = local_2610 + 4;
              }
              else {
                auVar57 = vpshufd_avx2(auVar59,0xff);
                vpermt2q_avx512vl(auVar54,auVar57,auVar55);
                auVar71 = vpminsd_avx2(auVar60,auVar57);
                auVar57 = vpmaxsd_avx2(auVar60,auVar57);
                auVar60 = vpminsd_avx2(auVar61,auVar57);
                auVar57 = vpmaxsd_avx2(auVar61,auVar57);
                auVar61 = vpminsd_avx2(auVar56,auVar57);
                auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                bVar17 = bVar17 - 1 & bVar17;
                if (bVar17 == 0) {
                  auVar57 = vpermi2q_avx512vl(auVar71,auVar54,auVar55);
                  uVar27 = auVar57._0_8_;
                  auVar57 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                  *local_2610 = auVar57._0_8_;
                  auVar56 = vpermd_avx2(auVar56,auVar53);
                  *(int *)(local_2610 + 1) = auVar56._0_4_;
                  auVar56 = vpermt2q_avx512vl(auVar54,auVar61,auVar55);
                  local_2610[2] = auVar56._0_8_;
                  auVar56 = vpermd_avx2(auVar61,auVar53);
                  *(int *)(local_2610 + 3) = auVar56._0_4_;
                  auVar54 = vpermt2q_avx512vl(auVar54,auVar60,auVar55);
                  local_2610[4] = auVar54._0_8_;
                  auVar53 = vpermd_avx2(auVar60,auVar53);
                  *(int *)(local_2610 + 5) = auVar53._0_4_;
                  local_2610 = local_2610 + 6;
                }
                else {
                  auVar58 = valignd_avx512vl(auVar59,auVar59,3);
                  auVar57 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar59 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar57,auVar71);
                  auVar57 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar60 = vpermt2d_avx512vl(auVar59,auVar57,auVar60);
                  auVar60 = vpermt2d_avx512vl(auVar60,auVar57,auVar61);
                  auVar57 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar56 = vpermt2d_avx512vl(auVar60,auVar57,auVar56);
                  auVar89 = ZEXT3264(auVar56);
                  bVar21 = bVar17;
                  do {
                    auVar57 = auVar89._0_32_;
                    auVar71._8_4_ = 1;
                    auVar71._0_8_ = 0x100000001;
                    auVar71._12_4_ = 1;
                    auVar71._16_4_ = 1;
                    auVar71._20_4_ = 1;
                    auVar71._24_4_ = 1;
                    auVar71._28_4_ = 1;
                    auVar56 = vpermd_avx2(auVar71,auVar58);
                    auVar58 = valignd_avx512vl(auVar58,auVar58,1);
                    vpermt2q_avx512vl(auVar54,auVar58,auVar55);
                    bVar21 = bVar21 - 1 & bVar21;
                    uVar14 = vpcmpd_avx512vl(auVar56,auVar57,5);
                    auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                    bVar20 = (byte)uVar14 << 1;
                    auVar57 = valignd_avx512vl(auVar57,auVar57,7);
                    bVar9 = (bool)((byte)uVar14 & 1);
                    auVar61._4_4_ = (uint)bVar9 * auVar57._4_4_ | (uint)!bVar9 * auVar56._4_4_;
                    auVar61._0_4_ = auVar56._0_4_;
                    bVar9 = (bool)(bVar20 >> 2 & 1);
                    auVar61._8_4_ = (uint)bVar9 * auVar57._8_4_ | (uint)!bVar9 * auVar56._8_4_;
                    bVar9 = (bool)(bVar20 >> 3 & 1);
                    auVar61._12_4_ = (uint)bVar9 * auVar57._12_4_ | (uint)!bVar9 * auVar56._12_4_;
                    bVar9 = (bool)(bVar20 >> 4 & 1);
                    auVar61._16_4_ = (uint)bVar9 * auVar57._16_4_ | (uint)!bVar9 * auVar56._16_4_;
                    bVar9 = (bool)(bVar20 >> 5 & 1);
                    auVar61._20_4_ = (uint)bVar9 * auVar57._20_4_ | (uint)!bVar9 * auVar56._20_4_;
                    bVar9 = (bool)(bVar20 >> 6 & 1);
                    auVar61._24_4_ = (uint)bVar9 * auVar57._24_4_ | (uint)!bVar9 * auVar56._24_4_;
                    auVar61._28_4_ =
                         (uint)(bVar20 >> 7) * auVar57._28_4_ |
                         (uint)!(bool)(bVar20 >> 7) * auVar56._28_4_;
                    auVar89 = ZEXT3264(auVar61);
                  } while (bVar21 != 0);
                  lVar19 = (ulong)(uint)POPCOUNT((uint)bVar17) + 3;
                  do {
                    auVar56 = vpermi2q_avx512vl(auVar61,auVar54,auVar55);
                    *local_2610 = auVar56._0_8_;
                    auVar57 = auVar89._0_32_;
                    auVar56 = vpermd_avx2(auVar57,auVar53);
                    *(int *)(local_2610 + 1) = auVar56._0_4_;
                    auVar61 = valignd_avx512vl(auVar57,auVar57,1);
                    local_2610 = local_2610 + 2;
                    auVar89 = ZEXT3264(auVar61);
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                  auVar53 = vpermt2q_avx512vl(auVar54,auVar61,auVar55);
                  uVar27 = auVar53._0_8_;
                }
                auVar89 = ZEXT3264(local_24e8);
                auVar90 = ZEXT3264(local_2508);
                auVar91 = ZEXT3264(local_2528);
                auVar92 = ZEXT3264(local_2548);
                auVar93 = ZEXT3264(local_2568);
                auVar75 = ZEXT3264(auVar75._0_32_);
                auVar83 = ZEXT3264(auVar83._0_32_);
                auVar84 = ZEXT3264(auVar84._0_32_);
                auVar85 = ZEXT3264(auVar85._0_32_);
                auVar86 = ZEXT3264(auVar86._0_32_);
                auVar87 = ZEXT3264(auVar87._0_32_);
                uVar26 = local_2650;
              }
            }
          }
        }
        local_2608 = (ulong)((uint)uVar27 & 0xf) - 8;
        if (local_2608 != 0) {
          uVar27 = uVar27 & 0xfffffffffffffff0;
          pSVar25 = context->scene;
          local_2600 = 0;
          local_2648 = pSVar25;
          do {
            lVar19 = local_2600 * 0x50;
            ppfVar4 = (pSVar25->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar27 + 0x30 + lVar19)];
            pfVar6 = ppfVar4[*(uint *)(uVar27 + 0x34 + lVar19)];
            pfVar7 = ppfVar4[*(uint *)(uVar27 + 0x38 + lVar19)];
            pfVar8 = ppfVar4[*(uint *)(uVar27 + 0x3c + lVar19)];
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + lVar19)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 8 + lVar19)))
            ;
            auVar50 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + lVar19)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 8 + lVar19)))
            ;
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 4 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0xc + lVar19)));
            auVar51 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 4 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0xc + lVar19)));
            auVar32 = vunpcklps_avx(auVar50,auVar51);
            auVar33 = vunpcklps_avx(auVar30,auVar31);
            auVar51 = vunpckhps_avx(auVar30,auVar31);
            auVar31 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x10 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x18 + lVar19)));
            auVar50 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x10 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x18 + lVar19)));
            auVar34 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x14 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x1c + lVar19)));
            auVar30 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x14 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x1c + lVar19)));
            auVar38 = vunpcklps_avx(auVar50,auVar30);
            auVar36 = vunpcklps_avx(auVar31,auVar34);
            auVar30 = vunpckhps_avx(auVar31,auVar34);
            auVar34 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x20 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x28 + lVar19)));
            auVar50 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x20 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x28 + lVar19)));
            auVar35 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x24 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x2c + lVar19)));
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x24 + lVar19)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x2c + lVar19)));
            auVar39 = vunpcklps_avx(auVar50,auVar31);
            auVar40 = vunpcklps_avx(auVar34,auVar35);
            auVar31 = vunpckhps_avx(auVar34,auVar35);
            puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar19);
            local_2428 = *puVar1;
            uStack_2420 = puVar1[1];
            puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar19);
            local_2578 = *puVar1;
            uStack_2570 = puVar1[1];
            uVar68 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar41._4_4_ = uVar68;
            auVar41._0_4_ = uVar68;
            auVar41._8_4_ = uVar68;
            auVar41._12_4_ = uVar68;
            uVar68 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar42._4_4_ = uVar68;
            auVar42._0_4_ = uVar68;
            auVar42._8_4_ = uVar68;
            auVar42._12_4_ = uVar68;
            auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar68 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar72._4_4_ = uVar68;
            auVar72._0_4_ = uVar68;
            auVar72._8_4_ = uVar68;
            auVar72._12_4_ = uVar68;
            uVar68 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar73._4_4_ = uVar68;
            auVar73._0_4_ = uVar68;
            auVar73._8_4_ = uVar68;
            auVar73._12_4_ = uVar68;
            local_2655 = 0;
            fVar62 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar76._4_4_ = fVar62;
            auVar76._0_4_ = fVar62;
            auVar76._8_4_ = fVar62;
            auVar76._12_4_ = fVar62;
            auVar50 = vsubps_avx(auVar33,auVar41);
            auVar51 = vsubps_avx(auVar51,auVar42);
            auVar35 = vsubps_avx512vl(auVar32,auVar34);
            auVar36 = vsubps_avx512vl(auVar36,auVar41);
            auVar37 = vsubps_avx512vl(auVar30,auVar42);
            auVar38 = vsubps_avx512vl(auVar38,auVar34);
            auVar30 = vsubps_avx(auVar40,auVar41);
            auVar31 = vsubps_avx(auVar31,auVar42);
            auVar39 = vsubps_avx512vl(auVar39,auVar34);
            auVar32 = vsubps_avx(auVar30,auVar50);
            auVar33 = vsubps_avx(auVar31,auVar51);
            auVar40 = vsubps_avx512vl(auVar39,auVar35);
            auVar41 = vsubps_avx512vl(auVar50,auVar36);
            auVar42 = vsubps_avx512vl(auVar51,auVar37);
            auVar43 = vsubps_avx512vl(auVar35,auVar38);
            auVar44 = vsubps_avx512vl(auVar36,auVar30);
            auVar45 = vsubps_avx512vl(auVar37,auVar31);
            auVar46 = vsubps_avx512vl(auVar38,auVar39);
            auVar49._0_4_ = auVar30._0_4_ + auVar50._0_4_;
            auVar49._4_4_ = auVar30._4_4_ + auVar50._4_4_;
            auVar49._8_4_ = auVar30._8_4_ + auVar50._8_4_;
            auVar49._12_4_ = auVar30._12_4_ + auVar50._12_4_;
            auVar74._0_4_ = auVar31._0_4_ + auVar51._0_4_;
            auVar74._4_4_ = auVar31._4_4_ + auVar51._4_4_;
            auVar74._8_4_ = auVar31._8_4_ + auVar51._8_4_;
            auVar74._12_4_ = auVar31._12_4_ + auVar51._12_4_;
            auVar34 = vaddps_avx512vl(auVar39,auVar35);
            auVar47 = vmulps_avx512vl(auVar74,auVar40);
            auVar47 = vfmsub231ps_avx512vl(auVar47,auVar33,auVar34);
            auVar34 = vmulps_avx512vl(auVar34,auVar32);
            auVar48 = vfmsub231ps_avx512vl(auVar34,auVar40,auVar49);
            auVar69._0_4_ = auVar33._0_4_ * auVar49._0_4_;
            auVar69._4_4_ = auVar33._4_4_ * auVar49._4_4_;
            auVar69._8_4_ = auVar33._8_4_ * auVar49._8_4_;
            auVar69._12_4_ = auVar33._12_4_ * auVar49._12_4_;
            auVar34 = vfmsub231ps_fma(auVar69,auVar32,auVar74);
            auVar70._0_4_ = fVar62 * auVar34._0_4_;
            auVar70._4_4_ = fVar62 * auVar34._4_4_;
            auVar70._8_4_ = fVar62 * auVar34._8_4_;
            auVar70._12_4_ = fVar62 * auVar34._12_4_;
            auVar34 = vfmadd231ps_avx512vl(auVar70,auVar73,auVar48);
            local_24c8 = vfmadd231ps_avx512vl(auVar34,auVar72,auVar47);
            auVar34 = vaddps_avx512vl(auVar50,auVar36);
            auVar47 = vaddps_avx512vl(auVar51,auVar37);
            auVar48 = vaddps_avx512vl(auVar35,auVar38);
            auVar49 = vmulps_avx512vl(auVar47,auVar43);
            auVar49 = vfmsub231ps_avx512vl(auVar49,auVar42,auVar48);
            auVar48 = vmulps_avx512vl(auVar48,auVar41);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar43,auVar34);
            auVar34 = vmulps_avx512vl(auVar34,auVar42);
            auVar34 = vfmsub231ps_avx512vl(auVar34,auVar41,auVar47);
            auVar47._0_4_ = fVar62 * auVar34._0_4_;
            auVar47._4_4_ = fVar62 * auVar34._4_4_;
            auVar47._8_4_ = fVar62 * auVar34._8_4_;
            auVar47._12_4_ = fVar62 * auVar34._12_4_;
            auVar34 = vfmadd231ps_avx512vl(auVar47,auVar73,auVar48);
            local_24b8 = vfmadd231ps_avx512vl(auVar34,auVar72,auVar49);
            auVar30 = vaddps_avx512vl(auVar36,auVar30);
            auVar31 = vaddps_avx512vl(auVar37,auVar31);
            auVar34 = vaddps_avx512vl(auVar38,auVar39);
            auVar38 = vmulps_avx512vl(auVar31,auVar46);
            auVar38 = vfmsub231ps_avx512vl(auVar38,auVar45,auVar34);
            auVar34 = vmulps_avx512vl(auVar34,auVar44);
            auVar34 = vfmsub231ps_avx512vl(auVar34,auVar46,auVar30);
            auVar39._0_4_ = auVar30._0_4_ * auVar45._0_4_;
            auVar39._4_4_ = auVar30._4_4_ * auVar45._4_4_;
            auVar39._8_4_ = auVar30._8_4_ * auVar45._8_4_;
            auVar39._12_4_ = auVar30._12_4_ * auVar45._12_4_;
            auVar30 = vfmsub231ps_fma(auVar39,auVar44,auVar31);
            auVar30 = vmulps_avx512vl(auVar76,auVar30);
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar73,auVar34);
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar72,auVar38);
            auVar37._0_4_ = local_24b8._0_4_ + local_24c8._0_4_;
            auVar37._4_4_ = local_24b8._4_4_ + local_24c8._4_4_;
            auVar37._8_4_ = local_24b8._8_4_ + local_24c8._8_4_;
            auVar37._12_4_ = local_24b8._12_4_ + local_24c8._12_4_;
            local_24a8 = vaddps_avx512vl(auVar30,auVar37);
            auVar38._8_4_ = 0x7fffffff;
            auVar38._0_8_ = 0x7fffffff7fffffff;
            auVar38._12_4_ = 0x7fffffff;
            auVar31 = vandps_avx512vl(local_24a8,auVar38);
            auVar36._8_4_ = 0x34000000;
            auVar36._0_8_ = 0x3400000034000000;
            auVar36._12_4_ = 0x34000000;
            auVar34 = vmulps_avx512vl(auVar31,auVar36);
            auVar38 = vminps_avx512vl(local_24c8,local_24b8);
            auVar38 = vminps_avx512vl(auVar38,auVar30);
            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar36 = vxorps_avx512vl(auVar34,auVar36);
            uVar14 = vcmpps_avx512vl(auVar38,auVar36,5);
            auVar38 = vmaxps_avx512vl(local_24c8,local_24b8);
            auVar30 = vmaxps_avx512vl(auVar38,auVar30);
            uVar10 = vcmpps_avx512vl(auVar30,auVar34,2);
            bVar17 = ((byte)uVar14 | (byte)uVar10) & 0xf;
            pSVar25 = local_2648;
            if (bVar17 != 0) {
              auVar30 = vmulps_avx512vl(auVar40,auVar42);
              auVar34 = vmulps_avx512vl(auVar32,auVar43);
              auVar38 = vmulps_avx512vl(auVar33,auVar41);
              auVar36 = vmulps_avx512vl(auVar43,auVar45);
              auVar39 = vmulps_avx512vl(auVar41,auVar46);
              auVar37 = vmulps_avx512vl(auVar42,auVar44);
              auVar33 = vfmsub213ps_avx512vl(auVar33,auVar43,auVar30);
              auVar40 = vfmsub213ps_avx512vl(auVar40,auVar41,auVar34);
              auVar32 = vfmsub213ps_avx512vl(auVar32,auVar42,auVar38);
              auVar42 = vfmsub213ps_avx512vl(auVar46,auVar42,auVar36);
              auVar43 = vfmsub213ps_avx512vl(auVar44,auVar43,auVar39);
              auVar41 = vfmsub213ps_avx512vl(auVar45,auVar41,auVar37);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar30 = vandps_avx512vl(auVar30,auVar44);
              auVar36 = vandps_avx512vl(auVar36,auVar44);
              uVar23 = vcmpps_avx512vl(auVar30,auVar36,1);
              auVar30 = vandps_avx512vl(auVar34,auVar44);
              auVar34 = vandps_avx512vl(auVar39,auVar44);
              uVar11 = vcmpps_avx512vl(auVar30,auVar34,1);
              auVar30 = vandps_avx512vl(auVar38,auVar44);
              auVar34 = vandps_avx512vl(auVar37,auVar44);
              uVar12 = vcmpps_avx512vl(auVar30,auVar34,1);
              bVar9 = (bool)((byte)uVar23 & 1);
              local_2458._0_4_ = (uint)bVar9 * auVar33._0_4_ | (uint)!bVar9 * auVar42._0_4_;
              bVar9 = (bool)((byte)(uVar23 >> 1) & 1);
              local_2458._4_4_ = (uint)bVar9 * auVar33._4_4_ | (uint)!bVar9 * auVar42._4_4_;
              bVar9 = (bool)((byte)(uVar23 >> 2) & 1);
              local_2458._8_4_ = (uint)bVar9 * auVar33._8_4_ | (uint)!bVar9 * auVar42._8_4_;
              bVar9 = (bool)((byte)(uVar23 >> 3) & 1);
              local_2458._12_4_ = (uint)bVar9 * auVar33._12_4_ | (uint)!bVar9 * auVar42._12_4_;
              bVar9 = (bool)((byte)uVar11 & 1);
              local_2448._0_4_ = (uint)bVar9 * auVar40._0_4_ | (uint)!bVar9 * auVar43._0_4_;
              bVar9 = (bool)((byte)(uVar11 >> 1) & 1);
              local_2448._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar43._4_4_;
              bVar9 = (bool)((byte)(uVar11 >> 2) & 1);
              local_2448._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar43._8_4_;
              bVar9 = (bool)((byte)(uVar11 >> 3) & 1);
              local_2448._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * auVar43._12_4_;
              bVar9 = (bool)((byte)uVar12 & 1);
              local_2438[0] = (float)((uint)bVar9 * auVar32._0_4_ | (uint)!bVar9 * auVar41._0_4_);
              bVar9 = (bool)((byte)(uVar12 >> 1) & 1);
              local_2438[1] = (float)((uint)bVar9 * auVar32._4_4_ | (uint)!bVar9 * auVar41._4_4_);
              bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
              local_2438[2] = (float)((uint)bVar9 * auVar32._8_4_ | (uint)!bVar9 * auVar41._8_4_);
              bVar9 = (bool)((byte)(uVar12 >> 3) & 1);
              local_2438[3] = (float)((uint)bVar9 * auVar32._12_4_ | (uint)!bVar9 * auVar41._12_4_);
              auVar44._0_4_ = fVar62 * local_2438[0];
              auVar44._4_4_ = fVar62 * local_2438[1];
              auVar44._8_4_ = fVar62 * local_2438[2];
              auVar44._12_4_ = fVar62 * local_2438[3];
              auVar30 = vfmadd213ps_fma(auVar73,local_2448,auVar44);
              auVar30 = vfmadd213ps_fma(auVar72,local_2458,auVar30);
              auVar40._0_4_ = auVar30._0_4_ + auVar30._0_4_;
              auVar40._4_4_ = auVar30._4_4_ + auVar30._4_4_;
              auVar40._8_4_ = auVar30._8_4_ + auVar30._8_4_;
              auVar40._12_4_ = auVar30._12_4_ + auVar30._12_4_;
              auVar43._0_4_ = auVar35._0_4_ * local_2438[0];
              auVar43._4_4_ = auVar35._4_4_ * local_2438[1];
              auVar43._8_4_ = auVar35._8_4_ * local_2438[2];
              auVar43._12_4_ = auVar35._12_4_ * local_2438[3];
              auVar51 = vfmadd213ps_fma(auVar51,local_2448,auVar43);
              auVar51 = vfmadd213ps_fma(auVar50,local_2458,auVar51);
              auVar50 = vrcp14ps_avx512vl(auVar40);
              auVar32 = auVar88._0_16_;
              auVar30 = vfnmadd213ps_avx512vl(auVar50,auVar40,auVar32);
              auVar50 = vfmadd132ps_fma(auVar30,auVar50,auVar50);
              local_2468._0_4_ = (auVar51._0_4_ + auVar51._0_4_) * auVar50._0_4_;
              local_2468._4_4_ = (auVar51._4_4_ + auVar51._4_4_) * auVar50._4_4_;
              local_2468._8_4_ = (auVar51._8_4_ + auVar51._8_4_) * auVar50._8_4_;
              local_2468._12_4_ = (auVar51._12_4_ + auVar51._12_4_) * auVar50._12_4_;
              auVar67 = ZEXT1664(local_2468);
              uVar68 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar50._4_4_ = uVar68;
              auVar50._0_4_ = uVar68;
              auVar50._8_4_ = uVar68;
              auVar50._12_4_ = uVar68;
              uVar14 = vcmpps_avx512vl(local_2468,auVar50,0xd);
              uVar23 = CONCAT44(auVar40._4_4_,auVar40._0_4_);
              auVar35._0_8_ = uVar23 ^ 0x8000000080000000;
              auVar35._8_4_ = -auVar40._8_4_;
              auVar35._12_4_ = -auVar40._12_4_;
              fVar62 = (ray->super_RayK<1>).tfar;
              auVar51._4_4_ = fVar62;
              auVar51._0_4_ = fVar62;
              auVar51._8_4_ = fVar62;
              auVar51._12_4_ = fVar62;
              uVar10 = vcmpps_avx512vl(local_2468,auVar51,2);
              uVar13 = vcmpps_avx512vl(auVar40,auVar35,4);
              bVar17 = (byte)uVar14 & (byte)uVar10 & (byte)uVar13 & bVar17;
              if (bVar17 != 0) {
                auVar45._0_4_ = (ray->super_RayK<1>).tfar;
                auVar45._4_4_ = (ray->super_RayK<1>).mask;
                auVar45._8_4_ = (ray->super_RayK<1>).id;
                auVar45._12_4_ = (ray->super_RayK<1>).flags;
                auVar75 = ZEXT1664(auVar45);
                uVar18 = vextractps_avx(auVar45,1);
                local_2498 = &local_2655;
                local_2490 = bVar17;
                auVar46._8_4_ = 0x219392ef;
                auVar46._0_8_ = 0x219392ef219392ef;
                auVar46._12_4_ = 0x219392ef;
                uVar23 = vcmpps_avx512vl(auVar31,auVar46,5);
                auVar50 = vrcp14ps_avx512vl(local_24a8);
                auVar51 = vfnmadd213ps_avx512vl(local_24a8,auVar50,auVar32);
                auVar50 = vfmadd132ps_avx512vl(auVar51,auVar50,auVar50);
                fVar79 = (float)((uint)((byte)uVar23 & 1) * auVar50._0_4_);
                fVar78 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar50._4_4_);
                fVar77 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar50._8_4_);
                fVar62 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar50._12_4_);
                auVar63._0_4_ = fVar79 * local_24c8._0_4_;
                auVar63._4_4_ = fVar78 * local_24c8._4_4_;
                auVar63._8_4_ = fVar77 * local_24c8._8_4_;
                auVar63._12_4_ = fVar62 * local_24c8._12_4_;
                local_2488 = vminps_avx512vl(auVar63,auVar32);
                auVar64._0_4_ = fVar79 * local_24b8._0_4_;
                auVar64._4_4_ = fVar78 * local_24b8._4_4_;
                auVar64._8_4_ = fVar77 * local_24b8._8_4_;
                auVar64._12_4_ = fVar62 * local_24b8._12_4_;
                local_2478 = vminps_avx512vl(auVar64,auVar32);
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar50 = vblendmps_avx512vl(auVar65,local_2468);
                auVar48._0_4_ =
                     (uint)(bVar17 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
                bVar9 = (bool)(bVar17 >> 1 & 1);
                auVar48._4_4_ = (uint)bVar9 * auVar50._4_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(bVar17 >> 2 & 1);
                auVar48._8_4_ = (uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * 0x7f800000;
                auVar48._12_4_ =
                     (uint)(bVar17 >> 3) * auVar50._12_4_ | (uint)!(bool)(bVar17 >> 3) * 0x7f800000;
                auVar50 = vshufps_avx(auVar48,auVar48,0xb1);
                auVar50 = vminps_avx(auVar50,auVar48);
                auVar51 = vshufpd_avx(auVar50,auVar50,1);
                auVar50 = vminps_avx(auVar51,auVar50);
                uVar14 = vcmpps_avx512vl(auVar48,auVar50,0);
                bVar21 = (byte)uVar14 & bVar17;
                do {
                  local_2654 = (uint)bVar17;
                  bVar20 = bVar17;
                  if (bVar21 != 0) {
                    bVar20 = bVar21;
                  }
                  uVar15 = 0;
                  for (uVar22 = (uint)bVar20; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000)
                  {
                    uVar15 = uVar15 + 1;
                  }
                  local_2640 = (ulong)uVar15;
                  local_25b0 = *(uint *)((long)&local_2428 + local_2640 * 4);
                  local_2618 = (pSVar25->geometries).items[local_25b0].ptr;
                  if ((local_2618->mask & uVar18) == 0) {
                    bVar17 = ~(byte)(1 << (uVar15 & 0x1f)) & bVar17;
                  }
                  else {
                    local_2620 = context->args;
                    local_2598 = auVar75._0_16_;
                    if (context->args->filter == (RTCFilterFunctionN)0x0) {
                      local_25f8.context = context->user;
                      if (local_2618->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar23 = (ulong)(uVar15 << 2);
                        fVar62 = *(float *)(local_2488 + uVar23);
                        fVar77 = *(float *)(local_2478 + uVar23);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2468 + uVar23);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2458 + uVar23);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2448 + uVar23);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_2438 + uVar23);
                        ray->u = fVar62;
                        ray->v = fVar77;
                        ray->primID = *(uint *)((long)&local_2578 + uVar23);
                        ray->geomID = local_25b0;
                        ray->instID[0] = (local_25f8.context)->instID[0];
                        ray->instPrimID[0] = (local_25f8.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_25f8.context = context->user;
                    }
                    uVar23 = (ulong)(uVar15 * 4);
                    local_25c8 = *(float *)(local_2458 + uVar23);
                    local_25c4 = *(undefined4 *)(local_2448 + uVar23);
                    local_25c0 = *(undefined4 *)((long)local_2438 + uVar23);
                    local_25bc = *(undefined4 *)(local_2488 + uVar23);
                    local_25b8 = *(undefined4 *)(local_2478 + uVar23);
                    local_25b4 = *(undefined4 *)((long)&local_2578 + uVar23);
                    local_25ac = (local_25f8.context)->instID[0];
                    local_25a8 = (local_25f8.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2468 + uVar23);
                    local_2634 = -1;
                    local_25f8.valid = &local_2634;
                    local_25f8.geometryUserPtr = local_2618->userPtr;
                    local_25f8.ray = (RTCRayN *)ray;
                    local_25f8.hit = (RTCHitN *)&local_25c8;
                    local_25f8.N = 1;
                    local_2588 = auVar67._0_16_;
                    if (local_2618->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f1b609:
                      if ((local_2620->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_2620->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2618->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_2620->filter)(&local_25f8);
                        auVar67 = ZEXT1664(local_2588);
                        auVar93 = ZEXT3264(local_2568);
                        auVar92 = ZEXT3264(local_2548);
                        auVar91 = ZEXT3264(local_2528);
                        auVar90 = ZEXT3264(local_2508);
                        auVar89 = ZEXT3264(local_24e8);
                        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar88 = ZEXT1664(auVar50);
                        ray = local_2630;
                        context = local_2628;
                        pSVar25 = local_2648;
                        uVar26 = local_2650;
                        if (*local_25f8.valid == 0) goto LAB_01f1b6fa;
                      }
                      (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25f8.hit;
                      (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25f8.hit + 4);
                      (((Vec3f *)((long)local_25f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25f8.hit + 8);
                      *(float *)((long)local_25f8.ray + 0x3c) = *(float *)(local_25f8.hit + 0xc);
                      *(float *)((long)local_25f8.ray + 0x40) = *(float *)(local_25f8.hit + 0x10);
                      *(float *)((long)local_25f8.ray + 0x44) = *(float *)(local_25f8.hit + 0x14);
                      *(float *)((long)local_25f8.ray + 0x48) = *(float *)(local_25f8.hit + 0x18);
                      *(float *)((long)local_25f8.ray + 0x4c) = *(float *)(local_25f8.hit + 0x1c);
                      *(float *)((long)local_25f8.ray + 0x50) = *(float *)(local_25f8.hit + 0x20);
                    }
                    else {
                      (*local_2618->intersectionFilterN)(&local_25f8);
                      auVar67 = ZEXT1664(local_2588);
                      auVar93 = ZEXT3264(local_2568);
                      auVar92 = ZEXT3264(local_2548);
                      auVar91 = ZEXT3264(local_2528);
                      auVar90 = ZEXT3264(local_2508);
                      auVar89 = ZEXT3264(local_24e8);
                      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar88 = ZEXT1664(auVar50);
                      ray = local_2630;
                      context = local_2628;
                      pSVar25 = local_2648;
                      uVar26 = local_2650;
                      if (*local_25f8.valid != 0) goto LAB_01f1b609;
LAB_01f1b6fa:
                      (local_2630->super_RayK<1>).tfar = (float)local_2598._0_4_;
                      ray = local_2630;
                      context = local_2628;
                      pSVar25 = local_2648;
                      uVar26 = local_2650;
                    }
                    auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar3._4_4_ = (ray->super_RayK<1>).mask;
                    auVar3._8_4_ = (ray->super_RayK<1>).id;
                    auVar3._12_4_ = (ray->super_RayK<1>).flags;
                    auVar75 = ZEXT1664(auVar3);
                    fVar62 = (ray->super_RayK<1>).tfar;
                    auVar16._4_4_ = fVar62;
                    auVar16._0_4_ = fVar62;
                    auVar16._8_4_ = fVar62;
                    auVar16._12_4_ = fVar62;
                    uVar14 = vcmpps_avx512vl(auVar67._0_16_,auVar16,2);
                    bVar17 = ~(byte)(1 << ((uint)local_2640 & 0x1f)) & (byte)local_2654 &
                             (byte)uVar14;
                    uVar18 = vextractps_avx(auVar3,1);
                  }
                  if (bVar17 == 0) break;
                  auVar66._8_4_ = 0x7f800000;
                  auVar66._0_8_ = 0x7f8000007f800000;
                  auVar66._12_4_ = 0x7f800000;
                  auVar50 = vblendmps_avx512vl(auVar66,auVar67._0_16_);
                  auVar52._0_4_ =
                       (uint)(bVar17 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
                  bVar9 = (bool)(bVar17 >> 1 & 1);
                  auVar52._4_4_ = (uint)bVar9 * auVar50._4_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)(bVar17 >> 2 & 1);
                  auVar52._8_4_ = (uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * 0x7f800000;
                  bVar9 = (bool)(bVar17 >> 3 & 1);
                  auVar52._12_4_ = (uint)bVar9 * auVar50._12_4_ | (uint)!bVar9 * 0x7f800000;
                  auVar50 = vshufps_avx(auVar52,auVar52,0xb1);
                  auVar50 = vminps_avx(auVar50,auVar52);
                  auVar51 = vshufpd_avx(auVar50,auVar50,1);
                  auVar50 = vminps_avx(auVar51,auVar50);
                  uVar14 = vcmpps_avx512vl(auVar52,auVar50,0);
                  bVar21 = (byte)uVar14 & bVar17;
                } while( true );
              }
            }
            local_2600 = local_2600 + 1;
          } while (local_2600 != local_2608);
        }
        fVar62 = (ray->super_RayK<1>).tfar;
        auVar67 = ZEXT3264(CONCAT428(fVar62,CONCAT424(fVar62,CONCAT420(fVar62,CONCAT416(fVar62,
                                                  CONCAT412(fVar62,CONCAT48(fVar62,CONCAT44(fVar62,
                                                  fVar62))))))));
        auVar75 = ZEXT3264(local_2398);
        auVar83 = ZEXT3264(local_23d8);
        auVar84 = ZEXT3264(local_23f8);
        auVar85 = ZEXT3264(local_2418);
        auVar86 = ZEXT3264(_DAT_01fe9900);
        auVar87 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        fVar62 = local_23b8;
        fVar77 = fStack_23b4;
        fVar78 = fStack_23b0;
        fVar79 = fStack_23ac;
        fVar80 = fStack_23a8;
        fVar81 = fStack_23a4;
        fVar82 = fStack_23a0;
      }
LAB_01f1b81b:
    } while (local_2610 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }